

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlFloat::RenderData(EbmlFloat *this,IOCallback *output,bool param_2,bool param_3)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 in_register_00000009;
  undefined1 *puVar4;
  undefined7 in_register_00000011;
  undefined8 *Buffer;
  big_int32 TmpToWrite;
  undefined1 local_28 [7];
  undefined1 uStack_21;
  undefined8 local_20;
  
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])
                    (this,output,CONCAT71(in_register_00000011,param_2),
                     CONCAT71(in_register_00000009,param_3));
  if ((CONCAT44(extraout_var,iVar2) != 4) &&
     (iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this),
     CONCAT44(extraout_var_00,iVar2) != 8)) {
    __assert_fail("GetSize() == 4 || GetSize() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                  ,0x5b,"virtual filepos_t libebml::EbmlFloat::RenderData(IOCallback &, bool, bool)"
                 );
  }
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  if (CONCAT44(extraout_var_01,iVar2) == 4) {
    Buffer = (undefined8 *)(local_28 + 4);
    _local_28 = (double)CONCAT44((float)this->Value,(float)this->Value);
    lVar3 = 4;
    puVar4 = local_28 + 7;
    do {
      uVar1 = local_28[lVar3];
      local_28[lVar3] = *puVar4;
      *puVar4 = uVar1;
      lVar3 = lVar3 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar3 != 6);
  }
  else {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_02,iVar2) != 8) goto LAB_00184580;
    _local_28 = this->Value;
    Buffer = &local_20;
    local_20 = _local_28;
    lVar3 = 8;
    puVar4 = (undefined1 *)((long)&local_20 + 7);
    do {
      uVar1 = local_28[lVar3];
      local_28[lVar3] = *puVar4;
      *puVar4 = uVar1;
      lVar3 = lVar3 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar3 != 0xc);
  }
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  IOCallback::writeFully(output,Buffer,CONCAT44(extraout_var_03,iVar2));
LAB_00184580:
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_04,iVar2);
}

Assistant:

filepos_t EbmlFloat::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  assert(GetSize() == 4 || GetSize() == 8);

  if (GetSize() == 4) {
    float val = Value;
    int Tmp;
    memcpy(&Tmp, &val, 4);
    big_int32 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  } else if (GetSize() == 8) {
    double val = Value;
    int64 Tmp;
    memcpy(&Tmp, &val, 8);
    big_int64 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  }

  return GetSize();
}